

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O2

void __thiscall cmRST::ProcessDirectiveTocTree(cmRST *this)

{
  bool bVar1;
  string *this_00;
  pointer s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  for (s = (this->MarkupLines).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      s != (this->MarkupLines).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish; s = s + 1) {
    if ((s->_M_string_length != 0) && (*(s->_M_dataplus)._M_p != ':')) {
      bVar1 = cmsys::RegularExpression::find(&this->TocTreeLink,s);
      if (bVar1) {
        cmsys::RegularExpression::match_abi_cxx11_(&local_50,&this->TocTreeLink,1);
        std::operator+(&local_70,&local_50,".rst");
        ProcessInclude(this,&local_70,IncludeTocTree);
        std::__cxx11::string::~string((string *)&local_70);
        this_00 = &local_50;
      }
      else {
        std::operator+(&local_90,s,".rst");
        ProcessInclude(this,&local_90,IncludeTocTree);
        this_00 = &local_90;
      }
      std::__cxx11::string::~string((string *)this_00);
    }
  }
  return;
}

Assistant:

void cmRST::ProcessDirectiveTocTree()
{
  // Process documents referenced by toctree directive.
  for (std::vector<std::string>::iterator i = this->MarkupLines.begin();
       i != this->MarkupLines.end(); ++i) {
    std::string const& line = *i;
    if (!line.empty() && line[0] != ':') {
      if (this->TocTreeLink.find(line)) {
        std::string const& link = this->TocTreeLink.match(1);
        this->ProcessInclude(link + ".rst", IncludeTocTree);
      } else {
        this->ProcessInclude(line + ".rst", IncludeTocTree);
      }
    }
  }
}